

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_draw.cpp
# Opt level: O0

int PalFromRGB(uint32 rgb)

{
  byte bVar1;
  int local_c;
  uint32 rgb_local;
  
  if ((LastPal < 0) || (LastRGB != rgb)) {
    if (rgb == 0xff000000) {
      LastPal = (int)GPalette.BlackIndex;
    }
    else if (rgb == 0xffffffff) {
      LastPal = (int)GPalette.WhiteIndex;
    }
    else {
      bVar1 = FColorMatcher::Pick(&ColorMatcher,rgb >> 0x10 & 0xff,rgb >> 8 & 0xff,rgb & 0xff);
      LastPal = (int)bVar1;
    }
    local_c = LastPal;
    LastRGB = rgb;
  }
  else {
    local_c = LastPal;
  }
  LastPal = local_c;
  return local_c;
}

Assistant:

static int PalFromRGB(uint32 rgb)
{
	if (LastPal >= 0 && LastRGB == rgb)
	{
		return LastPal;
	}
	// Quick check for black and white.
	if (rgb == MAKEARGB(255,0,0,0))
	{
		LastPal = GPalette.BlackIndex;
	}
	else if (rgb == MAKEARGB(255,255,255,255))
	{
		LastPal = GPalette.WhiteIndex;
	}
	else
	{
		LastPal = ColorMatcher.Pick(RPART(rgb), GPART(rgb), BPART(rgb));
	}
	LastRGB = rgb;
	return LastPal;
}